

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsHashTree.h
# Opt level: O1

bool __thiscall
HighsHashTree<int,_int>::InnerLeaf<3>::erase_entry
          (InnerLeaf<3> *this,uint64_t fullHash,int hashPos,int *key)

{
  int iVar1;
  ulong uVar2;
  ulong uVar3;
  int iVar4;
  long lVar5;
  ulong uVar6;
  int iVar7;
  int iVar8;
  ulong uVar9;
  ulong uVar10;
  ulong *puVar11;
  ulong uVar12;
  difference_type __d_1;
  long lVar13;
  bool bVar14;
  
  uVar9 = fullHash >> ((char)hashPos * -6 + 0x30U & 0x3f);
  uVar3 = (uVar9 & 0xffff) >> 10;
  uVar6 = (this->occupation).occupation;
  if ((uVar6 >> uVar3 & 1) == 0) {
    return false;
  }
  iVar7 = (int)POPCOUNT(uVar6 >> (sbyte)uVar3);
  iVar4 = 3 - iVar7;
  uVar2 = (ulong)(uint)(iVar7 * 8);
  do {
    uVar12 = uVar2;
    iVar4 = iVar4 + -1;
    uVar2 = uVar12 + 8;
  } while ((ushort)uVar3 < *(ushort *)((long)(this->hashes)._M_elems + (uVar12 - 8)) >> 10);
  uVar9 = uVar9 & 0xffff;
  iVar7 = -iVar4;
  do {
    uVar10 = uVar2;
    iVar7 = iVar7 + 1;
    uVar2 = uVar10 + 8;
  } while (uVar9 < *(ulong *)((long)(this->hashes)._M_elems + (uVar10 - 0x10)));
  iVar1 = this->size;
  if ((iVar1 == iVar7) || (*(ulong *)((long)(this->hashes)._M_elems + (uVar10 - 0x10)) != uVar9)) {
    bVar14 = false;
  }
  else {
    puVar11 = (ulong *)((long)(this->hashes)._M_elems + (uVar10 - 8));
    iVar8 = iVar7;
    do {
      bVar14 = *key == (int)puVar11[0x26];
      iVar7 = iVar8;
      if ((bVar14) || (iVar7 = iVar1, iVar8 - iVar1 == -1)) break;
      iVar7 = iVar8 + 1;
      uVar2 = *puVar11;
      puVar11 = puVar11 + 1;
      iVar8 = iVar7;
    } while (uVar2 == uVar9);
  }
  if (bVar14 == false) {
    return false;
  }
  this->size = iVar1 + -1;
  if (iVar7 < iVar1 + -1) {
    lVar13 = (long)(iVar7 + 1);
    lVar5 = (long)iVar7;
    if (iVar1 != iVar7 + 1) {
      memmove((this->entries)._M_elems + lVar5,(this->entries)._M_elems + lVar13,
              (iVar1 - lVar13) * 8);
    }
    memmove((this->hashes)._M_elems + lVar5,(this->hashes)._M_elems + lVar13,
            (this->size - lVar5) * 8);
    if (*(ushort *)((long)(this->hashes)._M_elems + (uVar12 - 8)) >> 10 == (ushort)uVar3)
    goto LAB_0027645e;
    uVar6 = (this->occupation).occupation;
  }
  else if (iVar7 + iVar4 != 1) goto LAB_0027645e;
  (this->occupation).occupation = uVar6 ^ 1L << (sbyte)uVar3;
LAB_0027645e:
  (this->hashes)._M_elems[this->size] = 0;
  return bVar14;
}

Assistant:

bool erase_entry(uint64_t fullHash, int hashPos, const K& key) {
      uint16_t hash = get_hash_chunks16(fullHash, hashPos);
      uint8_t hashChunk = get_first_chunk16(hash);
      if (!occupation.test(hashChunk)) return false;

      int startPos = occupation.num_set_until(hashChunk) - 1;
      while (get_first_chunk16(hashes[startPos]) > hashChunk) ++startPos;

      int pos = startPos;
      while (hashes[pos] > hash) ++pos;

      if (!find_key(key, hash, pos)) return false;

      --size;
      if (pos < size) {
        std::move(std::next(entries.begin(), pos + 1),
                  std::next(entries.begin(), size + 1),
                  std::next(entries.begin(), pos));
        memmove(&hashes[pos], &hashes[pos + 1],
                sizeof(hashes[0]) * (size - pos));
        if (get_first_chunk16(hashes[startPos]) != hashChunk)
          occupation.flip(hashChunk);
      } else if (startPos == pos)
        occupation.flip(hashChunk);

      hashes[size] = 0;
      return true;
    }